

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::cmLocalGenerator
          (cmLocalGenerator *this,cmGlobalGenerator *gg,cmMakefile *makefile)

{
  pointer *this_00;
  cmMakefile *pcVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined8 uVar3;
  bool bVar4;
  reference in_name;
  cmState *this_01;
  string *psVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  size_type sVar8;
  reference pvVar9;
  reference __k;
  mapped_type *this_02;
  long lVar10;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  undefined1 local_5b0 [8];
  string replaceVar;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<const_char_*> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_538;
  string *compilerOptionSysroot;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  string *compilerOptionExternalToolchain;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a8;
  string *compilerExternalToolchain;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_460;
  string *compilerOptionTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  string *compilerTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  string *compilerArg1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  string *lang;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string e;
  size_type i;
  undefined1 local_2b8 [8];
  cmList sysroots;
  cmList archs;
  string local_280;
  string *local_260;
  string *appleArchs;
  string local_250;
  cmValue local_230;
  cmValue appleArchSysroots;
  key_type local_220;
  string_view local_200;
  byte local_1ea;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  cmValue local_1a0;
  cmValue osxSysroot;
  string local_190;
  allocator<char> local_169;
  string local_168;
  cmValue local_148;
  cmValue sysrootLink;
  string local_138;
  allocator<char> local_111;
  string local_110;
  cmValue local_f0;
  cmValue sysrootCompile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  string *cp;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cpath;
  cmStateSnapshot local_38;
  cmMakefile *local_20;
  cmMakefile *makefile_local;
  cmGlobalGenerator *gg_local;
  cmLocalGenerator *this_local;
  
  local_20 = makefile;
  makefile_local = (cmMakefile *)gg;
  gg_local = (cmGlobalGenerator *)this;
  cmMakefile::GetStateSnapshot(&local_38,makefile);
  cmOutputConverter::cmOutputConverter(&this->super_cmOutputConverter,&local_38);
  (this->super_cmOutputConverter)._vptr_cmOutputConverter =
       (_func_int **)&PTR__cmLocalGenerator_017d4cb0;
  cmMakefile::GetBacktrace((cmMakefile *)&this->DirectoryBacktrace);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->UniqueObjectNamesMap);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ObjectMaxPathViolations);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->EnvCPATH);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>_>
  ::unordered_map(&this->GeneratorTargetSearchIndex);
  std::
  vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ::vector(&this->GeneratorTargets);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set(&this->WarnCMP0063);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>_>
  ::unordered_map(&this->ImportedGeneratorTargets);
  std::
  vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
  ::vector(&this->OwnedImportedGeneratorTargets);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->AliasTargets);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->Compilers);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->VariableMappings);
  std::__cxx11::string::string((string *)&this->CompilerSysroot);
  std::__cxx11::string::string((string *)&this->LinkerSysroot);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->AppleArchSysroots);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>_>_>
  ::unordered_map(&this->OutputToSource);
  this->GlobalGenerator = (cmGlobalGenerator *)makefile_local;
  this->Makefile = local_20;
  cmMakefile::GetAliasTargets_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&cpath.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,local_20);
  this_00 = &cpath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&this->AliasTargets,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)this_00);
  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;
  ComputeObjectMaxPath(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  cmsys::SystemTools::GetPath
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,"CPATH");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  cp = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&cp), bVar4) {
    in_name = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    bVar4 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar4) {
      cmsys::SystemTools::CollapseFullPath
                ((string *)
                 &enabledLanguages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,in_name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->EnvCPATH,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &enabledLanguages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &enabledLanguages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  this_01 = GetState(this);
  cmState::GetEnabledLanguages_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sysrootCompile,this_01);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"CMAKE_SYSROOT_COMPILE",&local_111);
  local_f0 = cmMakefile::GetDefinition(pcVar1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  bVar4 = cmValue::operator_cast_to_bool(&local_f0);
  if (bVar4) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_f0);
    std::__cxx11::string::operator=((string *)&this->CompilerSysroot,(string *)psVar5);
  }
  else {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"CMAKE_SYSROOT",
               (allocator<char> *)((long)&sysrootLink.Value + 7));
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_138);
    std::__cxx11::string::operator=((string *)&this->CompilerSysroot,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sysrootLink.Value + 7));
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"CMAKE_SYSROOT_LINK",&local_169);
  local_148 = cmMakefile::GetDefinition(pcVar1,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  bVar4 = cmValue::operator_cast_to_bool(&local_148);
  if (bVar4) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_148);
    std::__cxx11::string::operator=((string *)&this->LinkerSysroot,(string *)psVar5);
  }
  else {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"CMAKE_SYSROOT",(allocator<char> *)((long)&osxSysroot.Value + 7)
              );
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_190);
    std::__cxx11::string::operator=((string *)&this->LinkerSysroot,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&osxSysroot.Value + 7));
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"CMAKE_OSX_SYSROOT",&local_1c1);
  local_1a0 = cmMakefile::GetDefinition(pcVar1,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  bVar4 = cmValue::IsEmpty(&local_1a0);
  local_1ea = 0;
  if (bVar4) {
    std::allocator<char>::allocator();
    local_1ea = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"/",&local_1e9);
  }
  else {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_1a0);
    local_200 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    cmOutputConverter::EscapeForShell_abi_cxx11_
              (&local_1e8,&this->super_cmOutputConverter,local_200,true,false,false,false,false);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"CMAKE_OSX_SYSROOT",
             (allocator<char> *)((long)&appleArchSysroots.Value + 7));
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->VariableMappings,&local_220);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&appleArchSysroots.Value + 7));
  std::__cxx11::string::~string((string *)&local_1e8);
  if ((local_1ea & 1) != 0) {
    std::allocator<char>::~allocator(&local_1e9);
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"CMAKE_APPLE_ARCH_SYSROOTS",
             (allocator<char> *)((long)&appleArchs + 7));
  local_230 = cmMakefile::GetDefinition(pcVar1,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)((long)&appleArchs + 7));
  bVar4 = cmValue::operator_cast_to_bool(&local_230);
  if (bVar4) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"CMAKE_OSX_ARCHITECTURES",
               (allocator<char> *)
               ((long)&archs.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&archs.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_260 = psVar5;
    cmList::cmList((cmList *)
                   &sysroots.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar5,Yes,No);
    cmList::cmList((cmList *)local_2b8,local_230,Yes);
    sVar7 = cmList::size((cmList *)
                         &sysroots.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar8 = cmList::size((cmList *)local_2b8);
    if (sVar7 == sVar8) {
      e.field_2._8_8_ = 0;
      while( true ) {
        uVar3 = e.field_2._8_8_;
        sVar7 = cmList::size((cmList *)
                             &sysroots.Values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar7 <= (ulong)uVar3) break;
        pvVar9 = cmList::operator[][abi_cxx11_((cmList *)local_2b8,e.field_2._8_8_);
        __k = cmList::operator[][abi_cxx11_
                        ((cmList *)
                         &sysroots.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,e.field_2._8_8_);
        this_02 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this->AppleArchSysroots,__k);
        std::__cxx11::string::operator=((string *)this_02,(string *)pvVar9);
        e.field_2._8_8_ = e.field_2._8_8_ + 1;
      }
    }
    else {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_230);
      cmStrCat<char_const(&)[30],std::__cxx11::string_const&,char_const(&)[55],std::__cxx11::string_const&>
                ((string *)&__range1_1,(char (*) [30])"CMAKE_APPLE_ARCH_SYSROOTS:\n  ",psVar5,
                 (char (*) [55])"\nis not the same length as CMAKE_OSX_ARCHITECTURES:\n  ",local_260
                );
      IssueMessage(this,FATAL_ERROR,(string *)&__range1_1);
      std::__cxx11::string::~string((string *)&__range1_1);
    }
    cmList::~cmList((cmList *)local_2b8);
    cmList::~cmList((cmList *)
                    &sysroots.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&sysrootCompile);
  lang = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sysrootCompile);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&lang);
    if (!bVar4) break;
    local_308 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    bVar4 = std::operator==(local_308,"NONE");
    pbVar2 = local_308;
    if (!bVar4) {
      std::operator+(&local_348,"CMAKE_",local_308);
      std::operator+(&local_328,&local_348,"_COMPILER");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->Compilers,&local_328);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)pbVar2);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      pcVar1 = this->Makefile;
      std::operator+(&local_388,"CMAKE_",local_308);
      std::operator+(&local_368,&local_388,"_COMPILER");
      psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_368);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerArg1,"CMAKE_",local_308);
      std::operator+(&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerArg1,"_COMPILER");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->VariableMappings,&local_3a8);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&compilerArg1);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerTarget,"CMAKE_",local_308);
      std::operator+(&local_3f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerTarget,"_COMPILER_ARG1");
      std::__cxx11::string::~string((string *)&compilerTarget);
      local_3d0 = &local_3f0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerOptionTarget,"CMAKE_",local_308);
      std::operator+(&local_438,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerOptionTarget,"_COMPILER_TARGET");
      std::__cxx11::string::~string((string *)&compilerOptionTarget);
      local_418 = &local_438;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerExternalToolchain,"CMAKE_",local_308);
      std::operator+(&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerExternalToolchain,"_COMPILE_OPTIONS_TARGET");
      std::__cxx11::string::~string((string *)&compilerExternalToolchain);
      local_460 = &local_480;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerOptionExternalToolchain,"CMAKE_",local_308);
      std::operator+(&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerOptionExternalToolchain,"_COMPILER_EXTERNAL_TOOLCHAIN");
      std::__cxx11::string::~string((string *)&compilerOptionExternalToolchain);
      local_4a8 = &local_4c8;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerOptionSysroot,"CMAKE_",local_308);
      std::operator+(&local_510,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &compilerOptionSysroot,"_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
      std::__cxx11::string::~string((string *)&compilerOptionSysroot);
      local_4f0 = &local_510;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                     "CMAKE_",local_308);
      std::operator+(&local_558,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                     "_COMPILE_OPTIONS_SYSROOT");
      std::__cxx11::string::~string((string *)&__range2);
      local_538 = &local_558;
      psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,local_3d0);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->VariableMappings,local_3d0);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
      psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,local_418);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->VariableMappings,local_418);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
      psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,local_460);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->VariableMappings,local_460);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
      psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,local_4a8);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->VariableMappings,local_4a8);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
      psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,local_4f0);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->VariableMappings,local_4f0);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
      psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,local_538);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->VariableMappings,local_538);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
      __end2 = std::initializer_list<const_char_*>::begin(&ruleReplaceVars);
      replaceVar.field_2._8_8_ = std::initializer_list<const_char_*>::end(&ruleReplaceVars);
      for (; __end2 != (const_iterator)replaceVar.field_2._8_8_; __end2 = __end2 + 1) {
        __s = *__end2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_5b0,__s,&local_5b1);
        std::allocator<char>::~allocator(&local_5b1);
        lVar10 = std::__cxx11::string::find(local_5b0,0x1238e9f);
        if (lVar10 != -1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5d8,"${LANG}",&local_5d9);
          cmsys::SystemTools::ReplaceString((string *)local_5b0,&local_5d8,local_308);
          std::__cxx11::string::~string((string *)&local_5d8);
          std::allocator<char>::~allocator(&local_5d9);
        }
        psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_5b0);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->VariableMappings,(key_type *)local_5b0);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
        std::__cxx11::string::~string((string *)local_5b0);
      }
      std::__cxx11::string::~string((string *)&local_558);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&local_3f0);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sysrootCompile);
  return;
}

Assistant:

cmLocalGenerator::cmLocalGenerator(cmGlobalGenerator* gg, cmMakefile* makefile)
  : cmOutputConverter(makefile->GetStateSnapshot())
  , DirectoryBacktrace(makefile->GetBacktrace())
{
  this->GlobalGenerator = gg;

  this->Makefile = makefile;

  this->AliasTargets = makefile->GetAliasTargets();

  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;

  this->ComputeObjectMaxPath();

  // Canonicalize entries of the CPATH environment variable the same
  // way detection of CMAKE_<LANG>_IMPLICIT_INCLUDE_DIRECTORIES does.
  {
    std::vector<std::string> cpath;
    cmSystemTools::GetPath(cpath, "CPATH");
    for (std::string const& cp : cpath) {
      if (cmSystemTools::FileIsFullPath(cp)) {
        this->EnvCPATH.emplace_back(cmSystemTools::CollapseFullPath(cp));
      }
    }
  }

  std::vector<std::string> enabledLanguages =
    this->GetState()->GetEnabledLanguages();

  if (cmValue sysrootCompile =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_COMPILE")) {
    this->CompilerSysroot = *sysrootCompile;
  } else {
    this->CompilerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  if (cmValue sysrootLink =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
    this->LinkerSysroot = *sysrootLink;
  } else {
    this->LinkerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  // OSX SYSROOT can be required by some tools, like tapi
  {
    cmValue osxSysroot = this->Makefile->GetDefinition("CMAKE_OSX_SYSROOT");
    this->VariableMappings["CMAKE_OSX_SYSROOT"] =
      osxSysroot.IsEmpty() ? "/" : this->EscapeForShell(*osxSysroot, true);
  }

  if (cmValue appleArchSysroots =
        this->Makefile->GetDefinition("CMAKE_APPLE_ARCH_SYSROOTS")) {
    std::string const& appleArchs =
      this->Makefile->GetSafeDefinition("CMAKE_OSX_ARCHITECTURES");
    cmList archs(appleArchs);
    cmList sysroots{ appleArchSysroots, cmList::EmptyElements::Yes };
    if (archs.size() == sysroots.size()) {
      for (cmList::size_type i = 0; i < archs.size(); ++i) {
        this->AppleArchSysroots[archs[i]] = sysroots[i];
      }
    } else {
      std::string const e =
        cmStrCat("CMAKE_APPLE_ARCH_SYSROOTS:\n  ", *appleArchSysroots,
                 "\n"
                 "is not the same length as CMAKE_OSX_ARCHITECTURES:\n  ",
                 appleArchs);
      this->IssueMessage(MessageType::FATAL_ERROR, e);
    }
  }

  for (std::string const& lang : enabledLanguages) {
    if (lang == "NONE") {
      continue;
    }
    this->Compilers["CMAKE_" + lang + "_COMPILER"] = lang;

    this->VariableMappings["CMAKE_" + lang + "_COMPILER"] =
      this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER");

    std::string const& compilerArg1 = "CMAKE_" + lang + "_COMPILER_ARG1";
    std::string const& compilerTarget = "CMAKE_" + lang + "_COMPILER_TARGET";
    std::string const& compilerOptionTarget =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_TARGET";
    std::string const& compilerExternalToolchain =
      "CMAKE_" + lang + "_COMPILER_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionExternalToolchain =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionSysroot =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_SYSROOT";

    this->VariableMappings[compilerArg1] =
      this->Makefile->GetSafeDefinition(compilerArg1);
    this->VariableMappings[compilerTarget] =
      this->Makefile->GetSafeDefinition(compilerTarget);
    this->VariableMappings[compilerOptionTarget] =
      this->Makefile->GetSafeDefinition(compilerOptionTarget);
    this->VariableMappings[compilerExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerExternalToolchain);
    this->VariableMappings[compilerOptionExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerOptionExternalToolchain);
    this->VariableMappings[compilerOptionSysroot] =
      this->Makefile->GetSafeDefinition(compilerOptionSysroot);

    for (std::string replaceVar : ruleReplaceVars) {
      if (replaceVar.find("${LANG}") != std::string::npos) {
        cmSystemTools::ReplaceString(replaceVar, "${LANG}", lang);
      }

      this->VariableMappings[replaceVar] =
        this->Makefile->GetSafeDefinition(replaceVar);
    }
  }
}